

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_critical_section_start(void)

{
  int processing;
  undefined4 local_4;
  
  LOCK();
  UNLOCK();
  local_4 = g_state_barrier;
  g_state_barrier = g_state_barrier + 1;
  while (0 < local_4) {
    LOCK();
    g_state_barrier = g_state_barrier + -1;
    UNLOCK();
    sched_yield();
    LOCK();
    UNLOCK();
    local_4 = g_state_barrier;
    g_state_barrier = g_state_barrier + 1;
  }
  return;
}

Assistant:

inline static void ggml_critical_section_start(void) {
    int processing = atomic_fetch_add(&g_state_barrier, 1);

    while (processing > 0) {
        // wait for other threads to finish
        atomic_fetch_sub(&g_state_barrier, 1);
        sched_yield(); // TODO: reconsider this
        processing = atomic_fetch_add(&g_state_barrier, 1);
    }
}